

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

int __thiscall
EnvironmentNAVXYTHETALAT::SetStart
          (EnvironmentNAVXYTHETALAT *this,double x_m,double y_m,double theta_rad)

{
  double dVar1;
  undefined4 uVar2;
  ulong uVar3;
  long *in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined8 in_XMM2_Qa;
  EnvNAVXYTHETALATHashEntry_t *OutHashEntry;
  int theta;
  int y;
  int x;
  code *local_80;
  code *local_68;
  int local_50;
  int local_4c;
  int *local_40;
  int local_4;
  
  dVar1 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if (in_XMM0_Qa < 0.0) {
    local_4c = (int)(in_XMM0_Qa / (double)in_RDI[0x14]) + -1;
  }
  else {
    local_4c = (int)(in_XMM0_Qa / (double)in_RDI[0x14]);
  }
  if (dVar1 < 0.0) {
    local_50 = (int)(dVar1 / (double)in_RDI[0x14]) + -1;
  }
  else {
    local_50 = (int)(dVar1 / (double)in_RDI[0x14]);
  }
  uVar2 = (**(code **)(*in_RDI + 0x108))(in_XMM2_Qa);
  uVar3 = (**(code **)(*in_RDI + 400))(in_RDI,local_4c,local_50);
  if ((uVar3 & 1) == 0) {
    local_4 = -1;
  }
  else {
    (**(code **)(*in_RDI + 0x160))(in_RDI,local_4c,local_50,uVar2);
    local_68 = (code *)in_RDI[0x38];
    if (((ulong)local_68 & 1) != 0) {
      local_68 = *(code **)(local_68 + *(long *)((long)in_RDI + in_RDI[0x39]) + -1);
    }
    local_40 = (int *)(*local_68)((long *)((long)in_RDI + in_RDI[0x39]),local_4c,local_50,uVar2);
    if (local_40 == (int *)0x0) {
      local_80 = (code *)in_RDI[0x3a];
      if (((ulong)local_80 & 1) != 0) {
        local_80 = *(code **)(local_80 + *(long *)((long)in_RDI + in_RDI[0x3b]) + -1);
      }
      local_40 = (int *)(*local_80)((long *)((long)in_RDI + in_RDI[0x3b]),local_4c,local_50,uVar2);
    }
    if ((int)in_RDI[0x26] != *local_40) {
      *(undefined1 *)((long)in_RDI + 0x17d) = 1;
      *(undefined1 *)((long)in_RDI + 0x17e) = 1;
    }
    *(int *)(in_RDI + 0x26) = *local_40;
    *(int *)((long)in_RDI + 0x34) = local_4c;
    *(int *)(in_RDI + 7) = local_50;
    *(undefined4 *)((long)in_RDI + 0x3c) = uVar2;
    local_4 = (int)in_RDI[0x26];
  }
  return local_4;
}

Assistant:

int EnvironmentNAVXYTHETALAT::SetStart(double x_m, double y_m, double theta_rad)
{
    int x = CONTXY2DISC(x_m, EnvNAVXYTHETALATCfg.cellsize_m);
    int y = CONTXY2DISC(y_m, EnvNAVXYTHETALATCfg.cellsize_m);
    int theta = ContTheta2DiscNew(theta_rad);

    if (!IsWithinMapCell(x, y)) {
        SBPL_ERROR("ERROR: trying to set a start cell %d %d that is outside of map\n", x, y);
        return -1;
    }

    SBPL_PRINTF("env: setting start to %.3f %.3f %.3f (%d %d %d)\n", x_m, y_m, theta_rad, x, y, theta);

    if (!IsValidConfiguration(x, y, theta)) {
        SBPL_PRINTF("WARNING: start configuration %d %d %d is invalid\n", x, y, theta);
    }

    EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
    if ((OutHashEntry = (this->*GetHashEntry)(x, y, theta)) == NULL) {
        // have to create a new entry
        OutHashEntry = (this->*CreateNewHashEntry)(x, y, theta);
    }

    // need to recompute start heuristics?
    if (EnvNAVXYTHETALAT.startstateid != OutHashEntry->stateID) {
        bNeedtoRecomputeStartHeuristics = true;
        // because termination condition can be not all states TODO - make it dependent on term. condition
        bNeedtoRecomputeGoalHeuristics = true;
    }

    // set start
    EnvNAVXYTHETALAT.startstateid = OutHashEntry->stateID;
    EnvNAVXYTHETALATCfg.StartX_c = x;
    EnvNAVXYTHETALATCfg.StartY_c = y;
    EnvNAVXYTHETALATCfg.StartTheta = theta;

    return EnvNAVXYTHETALAT.startstateid;
}